

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httppost.cpp
# Opt level: O0

string * __thiscall hbm::HttpPost::execute(HttpPost *this,string *request)

{
  int iVar1;
  ostream *poVar2;
  ulong uVar3;
  SocketNonblocking *this_00;
  void *pBlock;
  ssize_t sVar4;
  socklen_t in_ECX;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  size_t position;
  string response;
  ssize_t retVal;
  char recvBuffer [1024];
  SocketNonblocking socket;
  stringstream message;
  size_t in_stack_fffffffffffbf928;
  void *in_stack_fffffffffffbf930;
  SocketNonblocking *in_stack_fffffffffffbf938;
  allocator *paVar5;
  size_t in_stack_fffffffffffbf940;
  allocator aStack_4065a;
  allocator aStack_40659;
  long lStack_40658;
  allocator aStack_40649;
  string asStack_40648 [39];
  allocator aStack_40621;
  ulong uStack_40620;
  char acStack_40618 [1023];
  undefined1 uStack_40219;
  undefined4 uStack_40218;
  allocator aStack_40211;
  string asStack_40210 [32];
  string asStack_401f0 [32];
  SocketNonblocking SStack_401d0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  string *local_18;
  
  local_18 = in_RDX;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar2 = std::operator<<(local_190,"POST ");
  poVar2 = std::operator<<(poVar2,in_RSI + 0x40);
  std::operator<<(poVar2," HTTP/1.0\r\n");
  poVar2 = std::operator<<(local_190,"Host: ");
  poVar2 = std::operator<<(poVar2,in_RSI);
  std::operator<<(poVar2,"\r\n");
  std::operator<<(local_190,"Accept: */*\r\n");
  poVar2 = std::operator<<(local_190,"Content-Type: application/json; charset=utf-8");
  std::operator<<(poVar2,"\r\n");
  poVar2 = std::operator<<(local_190,"Content-Length: ");
  uVar3 = std::__cxx11::string::length();
  this_00 = (SocketNonblocking *)std::ostream::operator<<(poVar2,uVar3);
  std::operator<<((ostream *)this_00,"\r\n");
  std::operator<<(local_190,"\r\n");
  std::operator<<(local_190,local_18);
  SocketNonblocking::SocketNonblocking((SocketNonblocking *)0x13d4ea);
  SocketNonblocking::connect(&SStack_401d0,(int)in_RSI,(sockaddr *)(in_RSI + 0x20),in_ECX);
  std::__cxx11::stringstream::str();
  pBlock = (void *)std::__cxx11::string::c_str();
  std::__cxx11::stringstream::str();
  std::__cxx11::string::length();
  sVar4 = SocketNonblocking::sendBlock
                    (this_00,pBlock,in_stack_fffffffffffbf940,
                     SUB81((ulong)in_stack_fffffffffffbf938 >> 0x38,0));
  std::__cxx11::string::~string(asStack_40210);
  std::__cxx11::string::~string(asStack_401f0);
  if (sVar4 < 1) {
    paVar5 = &aStack_40211;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",paVar5);
    std::allocator<char>::~allocator((allocator<char> *)&aStack_40211);
    uStack_40218 = 1;
  }
  else {
    uStack_40620 = SocketNonblocking::receiveComplete
                             (in_stack_fffffffffffbf938,in_stack_fffffffffffbf930,
                              in_stack_fffffffffffbf928);
    uStack_40219 = 0;
    poVar2 = std::operator<<((ostream *)&std::cout,acStack_40618);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    if ((long)uStack_40620 < 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"",&aStack_4065a);
      std::allocator<char>::~allocator((allocator<char> *)&aStack_4065a);
      uStack_40218 = 1;
    }
    else {
      if (execute(std::__cxx11::string_const&)::NEEDLE_abi_cxx11_ == '\0') {
        iVar1 = __cxa_guard_acquire(&execute(std::__cxx11::string_const&)::NEEDLE_abi_cxx11_);
        if (iVar1 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&execute(std::__cxx11::string_const&)::NEEDLE_abi_cxx11_,"\r\n\r\n",
                     &aStack_40621);
          std::allocator<char>::~allocator((allocator<char> *)&aStack_40621);
          __cxa_atexit(std::__cxx11::string::~string,
                       &execute(std::__cxx11::string_const&)::NEEDLE_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&execute(std::__cxx11::string_const&)::NEEDLE_abi_cxx11_);
        }
      }
      uVar3 = uStack_40620;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(asStack_40648,acStack_40618,uVar3,&aStack_40649);
      std::allocator<char>::~allocator((allocator<char> *)&aStack_40649);
      lStack_40658 = std::__cxx11::string::find(asStack_40648,0x1be6c0);
      if (lStack_40658 == -1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)in_RDI,"",&aStack_40659);
        std::allocator<char>::~allocator((allocator<char> *)&aStack_40659);
      }
      else {
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)in_RDI,(ulong)asStack_40648);
      }
      uStack_40218 = 1;
      std::__cxx11::string::~string(asStack_40648);
    }
  }
  SocketNonblocking::~SocketNonblocking((SocketNonblocking *)0x13d9ae);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

std::string HttpPost::execute(const std::string& request)
	{
		std::stringstream message;
		message << "POST " << m_httpPath << " HTTP/1.0\r\n";
		message << "Host: " << m_address << "\r\n";
		message << "Accept: */*\r\n";
		message << "Content-Type: application/json; charset=utf-8" << "\r\n";
		message << "Content-Length: " << request.length() << "\r\n";
		message << "\r\n";
		message << request;

		SocketNonblocking socket;
		socket.connect(m_address, m_port);

		if(socket.sendBlock(message.str().c_str(), message.str().length(), 0)<=0) {
			return "";
		}

		char recvBuffer[1024];
		// important HTTP 1.0 will return the response and close the socket afterwards. This does look like a short read.
		ssize_t retVal = socket.receiveComplete(recvBuffer, sizeof(recvBuffer));
		// ensure termination!
		recvBuffer[sizeof(recvBuffer)-1] = '\0';

		std::cout << recvBuffer << std::endl;
		if(retVal>0) {
			static const std::string NEEDLE("\r\n\r\n");

			std::string response(recvBuffer, retVal);
			// body with response is to be found after the first empty line
			size_t position = response.find(NEEDLE);
			if(position == std::string::npos) {
				return "";
			} else {
				return response.substr(position+NEEDLE.length());
			}
		}
		return "";
	}